

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_cod.c
# Opt level: O1

int pnm_type(uint_fast16_t magic)

{
  int iVar1;
  
  iVar1 = 0;
  if (magic - 0x5031 < 6) {
    iVar1 = *(int *)(magic * 4 + 0x12a738);
  }
  return iVar1;
}

Assistant:

int pnm_type(uint_fast16_t magic)
{
	int type;
	switch (magic) {
	case PNM_MAGIC_TXTPPM:
	case PNM_MAGIC_BINPPM:
		type = PNM_TYPE_PPM;
		break;
	case PNM_MAGIC_TXTPGM:
	case PNM_MAGIC_BINPGM:
		type = PNM_TYPE_PGM;
		break;
	case PNM_MAGIC_TXTPBM:
	case PNM_MAGIC_BINPBM:
		type = PNM_TYPE_PBM;
		break;
	default:
		/* This should not happen. */
		type = PNM_TYPE_INVALID;
		break;
	}
	return type;
}